

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_SpaceReuseForArraysSizeChecks_Test::TestBody
          (ArenaTest_SpaceReuseForArraysSizeChecks_Test *this)

{
  bool bVar1;
  reference ppvVar2;
  char *message;
  vector<void_*,_std::allocator<void_*>_> *container;
  UnorderedElementsAreArrayMatcher<void_*> *matcher;
  AssertHelper local_1e0;
  Message local_1d8;
  allocator<void_*> local_1c9;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_1c8;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_1c0;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_1b8;
  vector<void_*,_std::allocator<void_*>_> local_1b0;
  UnorderedElementsAreArrayMatcher<void_*> local_198;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<void_*>_>
  local_178;
  undefined1 local_158 [8];
  AssertionResult gtest_ar;
  int local_13c;
  undefined1 local_138 [4];
  int j_1;
  vector<void_*,_std::allocator<void_*>_> second_pointers;
  void *p;
  iterator __end3;
  iterator __begin3;
  vector<void_*,_std::allocator<void_*>_> *__range3;
  int local_f4;
  size_t sStack_f0;
  int j;
  size_t size;
  vector<void_*,_std::allocator<void_*>_> pointers;
  undefined1 local_c0 [8];
  Arena arena;
  ScopedTrace gtest_trace_1817;
  int i;
  ArenaTest_SpaceReuseForArraysSizeChecks_Test *this_local;
  
  arena.impl_.first_arena_.cached_blocks_._4_4_ = 0;
  while( true ) {
    if (0x13 < arena.impl_.first_arena_.cached_blocks_._4_4_) {
      return;
    }
    testing::ScopedTrace::ScopedTrace<int>
              ((ScopedTrace *)((long)&arena.impl_.first_arena_.cached_blocks_ + 3),
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x719,(int *)((long)&arena.impl_.first_arena_.cached_blocks_ + 4));
    Arena::Arena((Arena *)local_c0);
    std::vector<void_*,_std::allocator<void_*>_>::vector
              ((vector<void_*,_std::allocator<void_*>_> *)&size);
    sStack_f0 = (size_t)(0x10 << ((byte)arena.impl_.first_arena_.cached_blocks_._4_4_ & 0x1f));
    for (local_f4 = 0; local_f4 < 10; local_f4 = local_f4 + 1) {
      __range3 = (vector<void_*,_std::allocator<void_*>_> *)
                 Arena::CreateArray<char>((Arena *)local_c0,sStack_f0);
      std::vector<void_*,_std::allocator<void_*>_>::push_back
                ((vector<void_*,_std::allocator<void_*>_> *)&size,&__range3);
    }
    __end3 = std::vector<void_*,_std::allocator<void_*>_>::begin
                       ((vector<void_*,_std::allocator<void_*>_> *)&size);
    p = (void *)std::vector<void_*,_std::allocator<void_*>_>::end
                          ((vector<void_*,_std::allocator<void_*>_> *)&size);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                                       *)&p), bVar1) {
      ppvVar2 = __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                ::operator*(&__end3);
      second_pointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*ppvVar2;
      internal::ArenaTestPeer::ReturnArrayMemory
                ((Arena *)local_c0,
                 second_pointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,sStack_f0);
      __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
      operator++(&__end3);
    }
    std::vector<void_*,_std::allocator<void_*>_>::vector
              ((vector<void_*,_std::allocator<void_*>_> *)local_138);
    for (local_13c = 9; local_13c != 0; local_13c = local_13c + -1) {
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )Arena::CreateArray<char>((Arena *)local_c0,sStack_f0);
      std::vector<void_*,_std::allocator<void_*>_>::push_back
                ((vector<void_*,_std::allocator<void_*>_> *)local_138,
                 (value_type *)&gtest_ar.message_);
    }
    local_1c0._M_current =
         (void **)std::vector<void_*,_std::allocator<void_*>_>::begin
                            ((vector<void_*,_std::allocator<void_*>_> *)&size);
    local_1b8 = __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                ::operator+(&local_1c0,1);
    local_1c8._M_current =
         (void **)std::vector<void_*,_std::allocator<void_*>_>::end
                            ((vector<void_*,_std::allocator<void_*>_> *)&size);
    std::allocator<void_*>::allocator(&local_1c9);
    std::vector<void*,std::allocator<void*>>::
    vector<__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>,void>
              ((vector<void*,std::allocator<void*>> *)&local_1b0,local_1b8,local_1c8,&local_1c9);
    testing::UnorderedElementsAreArray<std::vector<void*,std::allocator<void*>>>
              (&local_198,(testing *)&local_1b0,container);
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<void*>>
              (&local_178,(internal *)&local_198,matcher);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<void*>>::
    operator()(local_158,(char *)&local_178,
               (vector<void_*,_std::allocator<void_*>_> *)"second_pointers");
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<void_*>_>::
    ~PredicateFormatterFromMatcher(&local_178);
    testing::internal::UnorderedElementsAreArrayMatcher<void_*>::~UnorderedElementsAreArrayMatcher
              (&local_198);
    std::vector<void_*,_std::allocator<void_*>_>::~vector(&local_1b0);
    std::allocator<void_*>::~allocator(&local_1c9);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
    if (!bVar1) {
      testing::Message::Message(&local_1d8);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_158);
      testing::internal::AssertHelper::AssertHelper
                (&local_1e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x730,message);
      testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
      testing::internal::AssertHelper::~AssertHelper(&local_1e0);
      testing::Message::~Message(&local_1d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
    std::vector<void_*,_std::allocator<void_*>_>::~vector
              ((vector<void_*,_std::allocator<void_*>_> *)local_138);
    std::vector<void_*,_std::allocator<void_*>_>::~vector
              ((vector<void_*,_std::allocator<void_*>_> *)&size);
    Arena::~Arena((Arena *)local_c0);
    testing::ScopedTrace::~ScopedTrace
              ((ScopedTrace *)((long)&arena.impl_.first_arena_.cached_blocks_ + 3));
    if (!bVar1) break;
    arena.impl_.first_arena_.cached_blocks_._4_4_ =
         arena.impl_.first_arena_.cached_blocks_._4_4_ + 1;
  }
  return;
}

Assistant:

TEST(ArenaTest, SpaceReuseForArraysSizeChecks) {
  // Limit to 1<<20 to avoid using too much memory on the test.
  for (int i = 0; i < 20; ++i) {
    SCOPED_TRACE(i);
    Arena arena;
    std::vector<void*> pointers;

    const size_t size = 16 << i;

    for (int j = 0; j < 10; ++j) {
      pointers.push_back(Arena::CreateArray<char>(&arena, size));
    }

    for (void* p : pointers) {
      internal::ArenaTestPeer::ReturnArrayMemory(&arena, p, size);
    }

    std::vector<void*> second_pointers;
    for (int j = 9; j != 0; --j) {
      second_pointers.push_back(Arena::CreateArray<char>(&arena, size));
    }

    // The arena will give us back the pointers we returned, except the first
    // one. That one becomes part of the freelist data structure.
    ASSERT_THAT(second_pointers,
                testing::UnorderedElementsAreArray(
                    std::vector<void*>(pointers.begin() + 1, pointers.end())));
  }
}